

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaExporter::WriteFloatArray
          (ColladaExporter *this,string *pIdString,FloatDataType pType,ai_real *pData,
          size_t pElementCount)

{
  undefined1 *this_00;
  string *psVar1;
  string *psVar2;
  long lVar3;
  ostream *poVar4;
  size_t a;
  long lVar5;
  char *pcVar6;
  float *pfVar7;
  bool bVar8;
  string arrayId;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (FloatType_Time < pType) {
    return;
  }
  lVar3 = *(long *)(&DAT_005bcd18 + (ulong)pType * 8);
  XMLIDEncode(&local_90,pIdString);
  std::operator+(&local_70,&local_90,"-array");
  std::__cxx11::string::~string((string *)&local_90);
  this_00 = &this->field_0x38;
  psVar1 = &this->startstr;
  poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"<source id=\"");
  XMLIDEncode(&local_90,pIdString);
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  poVar4 = std::operator<<(poVar4,"\" name=\"");
  XMLEscape(&local_50,pIdString);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"\">");
  psVar2 = &this->endstr;
  std::operator<<(poVar4,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  PushTag(this);
  poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"<float_array id=\"");
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,"\" count=\"");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"\"> ");
  PushTag(this);
  if (pType == FloatType_TexCoord2) {
    pfVar7 = pData + 1;
    while (bVar8 = pElementCount != 0, pElementCount = pElementCount - 1, bVar8) {
      poVar4 = (ostream *)std::ostream::operator<<(this_00,pfVar7[-1]);
      std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<(this_00,*pfVar7);
      std::operator<<(poVar4," ");
      pfVar7 = pfVar7 + 3;
    }
  }
  else if (pType == FloatType_Color) {
    pfVar7 = pData + 2;
    while (bVar8 = pElementCount != 0, pElementCount = pElementCount - 1, bVar8) {
      poVar4 = (ostream *)std::ostream::operator<<(this_00,pfVar7[-2]);
      std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<(this_00,pfVar7[-1]);
      std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<(this_00,*pfVar7);
      std::operator<<(poVar4," ");
      pfVar7 = pfVar7 + 4;
    }
  }
  else {
    for (lVar5 = 0; lVar3 * pElementCount - lVar5 != 0; lVar5 = lVar5 + 1) {
      poVar4 = (ostream *)std::ostream::operator<<(this_00,pData[lVar5]);
      std::operator<<(poVar4," ");
    }
  }
  poVar4 = std::operator<<((ostream *)this_00,"</float_array>");
  std::operator<<(poVar4,(string *)psVar2);
  PopTag(this);
  poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"<technique_common>");
  std::operator<<(poVar4,(string *)psVar2);
  PushTag(this);
  poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"<accessor count=\"");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"\" offset=\"0\" source=\"#");
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,"\" stride=\"");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"\">");
  std::operator<<(poVar4,(string *)psVar2);
  PushTag(this);
  switch((ulong)pType) {
  case 0:
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,"<param name=\"X\" type=\"float\" />");
    std::operator<<(poVar4,(string *)psVar2);
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,"<param name=\"Y\" type=\"float\" />");
    std::operator<<(poVar4,(string *)psVar2);
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    pcVar6 = "<param name=\"Z\" type=\"float\" />";
    break;
  case 1:
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,"<param name=\"S\" type=\"float\" />");
    std::operator<<(poVar4,(string *)psVar2);
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    pcVar6 = "<param name=\"T\" type=\"float\" />";
    break;
  case 2:
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,"<param name=\"S\" type=\"float\" />");
    std::operator<<(poVar4,(string *)psVar2);
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,"<param name=\"T\" type=\"float\" />");
    std::operator<<(poVar4,(string *)psVar2);
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    pcVar6 = "<param name=\"P\" type=\"float\" />";
    break;
  case 3:
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,"<param name=\"R\" type=\"float\" />");
    std::operator<<(poVar4,(string *)psVar2);
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,"<param name=\"G\" type=\"float\" />");
    std::operator<<(poVar4,(string *)psVar2);
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    pcVar6 = "<param name=\"B\" type=\"float\" />";
    break;
  case 4:
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    pcVar6 = "<param name=\"TRANSFORM\" type=\"float4x4\" />";
    break;
  case 5:
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    pcVar6 = "<param name=\"WEIGHT\" type=\"float\" />";
    break;
  case 6:
    poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
    pcVar6 = "<param name=\"TIME\" type=\"float\" />";
    break;
  default:
    goto switchD_0032deaa_default;
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  std::operator<<(poVar4,(string *)psVar2);
switchD_0032deaa_default:
  PopTag(this);
  poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"</accessor>");
  std::operator<<(poVar4,(string *)psVar2);
  PopTag(this);
  poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"</technique_common>");
  std::operator<<(poVar4,(string *)psVar2);
  PopTag(this);
  poVar4 = std::operator<<((ostream *)this_00,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"</source>");
  std::operator<<(poVar4,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void ColladaExporter::WriteFloatArray( const std::string& pIdString, FloatDataType pType, const ai_real* pData, size_t pElementCount)
{
    size_t floatsPerElement = 0;
    switch( pType )
    {
        case FloatType_Vector: floatsPerElement = 3; break;
        case FloatType_TexCoord2: floatsPerElement = 2; break;
        case FloatType_TexCoord3: floatsPerElement = 3; break;
        case FloatType_Color: floatsPerElement = 3; break;
        case FloatType_Mat4x4: floatsPerElement = 16; break;
        case FloatType_Weight: floatsPerElement = 1; break;
		case FloatType_Time: floatsPerElement = 1; break;
        default:
            return;
    }

    std::string arrayId = XMLIDEncode(pIdString) + "-array";

    mOutput << startstr << "<source id=\"" << XMLIDEncode(pIdString) << "\" name=\"" << XMLEscape(pIdString) << "\">" << endstr;
    PushTag();

    // source array
    mOutput << startstr << "<float_array id=\"" << arrayId << "\" count=\"" << pElementCount * floatsPerElement << "\"> ";
    PushTag();

    if( pType == FloatType_TexCoord2 )
    {
        for( size_t a = 0; a < pElementCount; ++a )
        {
            mOutput << pData[a*3+0] << " ";
            mOutput << pData[a*3+1] << " ";
        }
    }
    else if( pType == FloatType_Color )
    {
        for( size_t a = 0; a < pElementCount; ++a )
        {
            mOutput << pData[a*4+0] << " ";
            mOutput << pData[a*4+1] << " ";
            mOutput << pData[a*4+2] << " ";
        }
    }
    else
    {
        for( size_t a = 0; a < pElementCount * floatsPerElement; ++a )
            mOutput << pData[a] << " ";
    }
    mOutput << "</float_array>" << endstr;
    PopTag();

    // the usual Collada fun. Let's bloat it even more!
    mOutput << startstr << "<technique_common>" << endstr;
    PushTag();
    mOutput << startstr << "<accessor count=\"" << pElementCount << "\" offset=\"0\" source=\"#" << arrayId << "\" stride=\"" << floatsPerElement << "\">" << endstr;
    PushTag();

    switch( pType )
    {
        case FloatType_Vector:
            mOutput << startstr << "<param name=\"X\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"Y\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"Z\" type=\"float\" />" << endstr;
            break;

        case FloatType_TexCoord2:
            mOutput << startstr << "<param name=\"S\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"T\" type=\"float\" />" << endstr;
            break;

        case FloatType_TexCoord3:
            mOutput << startstr << "<param name=\"S\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"T\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"P\" type=\"float\" />" << endstr;
            break;

        case FloatType_Color:
            mOutput << startstr << "<param name=\"R\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"G\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"B\" type=\"float\" />" << endstr;
            break;

        case FloatType_Mat4x4:
            mOutput << startstr << "<param name=\"TRANSFORM\" type=\"float4x4\" />" << endstr;
            break;

        case FloatType_Weight:
            mOutput << startstr << "<param name=\"WEIGHT\" type=\"float\" />" << endstr;
            break;

		// customized, add animation related
		case FloatType_Time:
			mOutput << startstr << "<param name=\"TIME\" type=\"float\" />" << endstr;
			break;

	}

    PopTag();
    mOutput << startstr << "</accessor>" << endstr;
    PopTag();
    mOutput << startstr << "</technique_common>" << endstr;
    PopTag();
    mOutput << startstr << "</source>" << endstr;
}